

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::Parser::ConsumeIdentifier(Parser *this,string *output,char *error)

{
  char *pcVar1;
  bool bVar2;
  Token *pTVar3;
  allocator local_49;
  string local_48;
  char *local_28;
  char *error_local;
  string *output_local;
  Parser *this_local;
  
  local_28 = error;
  error_local = (char *)output;
  output_local = (string *)this;
  bVar2 = LookingAtType(this,TYPE_IDENTIFIER);
  pcVar1 = local_28;
  if (bVar2) {
    pTVar3 = io::Tokenizer::current(this->input_);
    std::__cxx11::string::operator=((string *)error_local,(string *)&pTVar3->text);
    io::Tokenizer::Next(this->input_);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_48,pcVar1,&local_49);
    AddError(this,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
  }
  return bVar2;
}

Assistant:

bool Parser::ConsumeIdentifier(std::string* output, const char* error) {
  if (LookingAtType(io::Tokenizer::TYPE_IDENTIFIER)) {
    *output = input_->current().text;
    input_->Next();
    return true;
  } else {
    AddError(error);
    return false;
  }
}